

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O3

int itf8_decode(cram_fd *fd,int32_t *val_p)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  byte *pbVar6;
  byte *pbVar7;
  uint uVar8;
  byte *pbVar9;
  hFILE *phVar10;
  
  phVar10 = fd->fp;
  pbVar9 = (byte *)phVar10->begin;
  if (pbVar9 < phVar10->end) {
    phVar10->begin = (char *)(pbVar9 + 1);
    uVar1 = (uint)*pbVar9;
  }
  else {
    uVar1 = hgetc2(phVar10);
    if (uVar1 == 0xffffffff) {
      return -1;
    }
  }
  if ((uint)itf8_decode::nbytes[(int)uVar1 >> 4] < 5) {
    uVar8 = uVar1 & itf8_decode::nbits[(int)uVar1 >> 4];
    switch(itf8_decode::nbytes[(int)uVar1 >> 4]) {
    case 0:
      iVar2 = 1;
      break;
    case 1:
      phVar10 = fd->fp;
      pbVar9 = (byte *)phVar10->begin;
      if (pbVar9 < phVar10->end) {
        phVar10->begin = (char *)(pbVar9 + 1);
        uVar1 = (uint)*pbVar9;
      }
      else {
        uVar1 = hgetc2(phVar10);
      }
      uVar8 = uVar8 << 8 | uVar1 & 0xff;
      iVar2 = 2;
      break;
    case 2:
      phVar10 = fd->fp;
      pbVar9 = (byte *)phVar10->begin;
      pbVar6 = (byte *)phVar10->end;
      if (pbVar9 < pbVar6) {
        pbVar7 = pbVar9 + 1;
        phVar10->begin = (char *)pbVar7;
        uVar1 = (uint)*pbVar9;
      }
      else {
        uVar1 = hgetc2(phVar10);
        phVar10 = fd->fp;
        pbVar7 = (byte *)phVar10->begin;
        pbVar6 = (byte *)phVar10->end;
      }
      if (pbVar7 < pbVar6) {
        phVar10->begin = (char *)(pbVar7 + 1);
        uVar3 = (uint)*pbVar7;
      }
      else {
        uVar3 = hgetc2(phVar10);
      }
      uVar8 = uVar3 & 0xff | (uVar1 & 0xff) << 8 | uVar8 << 0x10;
      iVar2 = 3;
      break;
    case 3:
      phVar10 = fd->fp;
      pbVar9 = (byte *)phVar10->begin;
      pbVar6 = (byte *)phVar10->end;
      if (pbVar9 < pbVar6) {
        pbVar7 = pbVar9 + 1;
        phVar10->begin = (char *)pbVar7;
        uVar1 = (uint)*pbVar9;
      }
      else {
        uVar1 = hgetc2(phVar10);
        phVar10 = fd->fp;
        pbVar7 = (byte *)phVar10->begin;
        pbVar6 = (byte *)phVar10->end;
      }
      if (pbVar7 < pbVar6) {
        pbVar9 = pbVar7 + 1;
        phVar10->begin = (char *)pbVar9;
        uVar3 = (uint)*pbVar7;
      }
      else {
        uVar3 = hgetc2(phVar10);
        phVar10 = fd->fp;
        pbVar9 = (byte *)phVar10->begin;
        pbVar6 = (byte *)phVar10->end;
      }
      if (pbVar9 < pbVar6) {
        phVar10->begin = (char *)(pbVar9 + 1);
        uVar4 = (uint)*pbVar9;
      }
      else {
        uVar4 = hgetc2(phVar10);
      }
      uVar8 = uVar4 & 0xff | (uVar3 & 0xff | (uVar1 & 0xff) << 8 | uVar8 << 0x10) << 8;
      iVar2 = 4;
      break;
    case 4:
      phVar10 = fd->fp;
      pbVar9 = (byte *)phVar10->begin;
      pbVar6 = (byte *)phVar10->end;
      if (pbVar9 < pbVar6) {
        pbVar7 = pbVar9 + 1;
        phVar10->begin = (char *)pbVar7;
        uVar1 = (uint)*pbVar9;
      }
      else {
        uVar1 = hgetc2(phVar10);
        phVar10 = fd->fp;
        pbVar7 = (byte *)phVar10->begin;
        pbVar6 = (byte *)phVar10->end;
      }
      if (pbVar7 < pbVar6) {
        pbVar9 = pbVar7 + 1;
        phVar10->begin = (char *)pbVar9;
        uVar3 = (uint)*pbVar7;
      }
      else {
        uVar3 = hgetc2(phVar10);
        phVar10 = fd->fp;
        pbVar9 = (byte *)phVar10->begin;
        pbVar6 = (byte *)phVar10->end;
      }
      if (pbVar9 < pbVar6) {
        pbVar7 = pbVar9 + 1;
        phVar10->begin = (char *)pbVar7;
        uVar4 = (uint)*pbVar9;
      }
      else {
        uVar4 = hgetc2(phVar10);
        phVar10 = fd->fp;
        pbVar7 = (byte *)phVar10->begin;
        pbVar6 = (byte *)phVar10->end;
      }
      if (pbVar7 < pbVar6) {
        phVar10->begin = (char *)(pbVar7 + 1);
        uVar5 = (uint)*pbVar7;
      }
      else {
        uVar5 = hgetc2(phVar10);
      }
      uVar8 = uVar5 & 0xf |
              (uVar4 & 0xff) << 4 | (uVar3 & 0xff | (uVar1 & 0xff) << 8 | uVar8 << 0x10) << 0xc;
      iVar2 = 5;
    }
    *val_p = uVar8;
  }
  else {
    iVar2 = 5;
  }
  return iVar2;
}

Assistant:

int itf8_decode(cram_fd *fd, int32_t *val_p) {
    static int nbytes[16] = {
	0,0,0,0, 0,0,0,0,                               // 0000xxxx - 0111xxxx
	1,1,1,1,                                        // 1000xxxx - 1011xxxx
	2,2,                                            // 1100xxxx - 1101xxxx
	3,                                              // 1110xxxx
	4,                                              // 1111xxxx
    };

    static int nbits[16] = {
	0x7f, 0x7f, 0x7f, 0x7f, 0x7f, 0x7f, 0x7f, 0x7f, // 0000xxxx - 0111xxxx
	0x3f, 0x3f, 0x3f, 0x3f,                         // 1000xxxx - 1011xxxx
	0x1f, 0x1f,                                     // 1100xxxx - 1101xxxx
	0x0f,                                           // 1110xxxx
	0x0f,                                           // 1111xxxx
    };

    int32_t val = hgetc(fd->fp);
    if (val == -1)
	return -1;

    int i = nbytes[val>>4];
    val &= nbits[val>>4];

    switch(i) {
    case 0:
	*val_p = val;
	return 1;

    case 1:
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	*val_p = val;
	return 2;

    case 2:
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	*val_p = val;
	return 3;

    case 3:
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	*val_p = val;
	return 4;

    case 4: // really 3.5 more, why make it different?
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<4) | (((unsigned char)hgetc(fd->fp)) & 0x0f);
	*val_p = val;
    }

    return 5;
}